

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.c
# Opt level: O2

int utf8_encode(int32_t codepoint,char *buffer,size_t *size)

{
  int iVar1;
  byte bVar2;
  size_t sStack_8;
  
  iVar1 = -1;
  if (-1 < codepoint) {
    bVar2 = (byte)codepoint;
    if ((uint)codepoint < 0x80) {
      *buffer = bVar2;
      sStack_8 = 1;
    }
    else if ((uint)codepoint < 0x800) {
      *buffer = (byte)((uint)codepoint >> 6) | 0xc0;
      buffer[1] = bVar2 & 0x3f | 0x80;
      sStack_8 = 2;
    }
    else if ((uint)codepoint < 0x10000) {
      *buffer = (byte)((uint)codepoint >> 0xc) | 0xe0;
      buffer[1] = (byte)((uint)codepoint >> 6) & 0x3f | 0x80;
      buffer[2] = bVar2 & 0x3f | 0x80;
      sStack_8 = 3;
    }
    else {
      if (0x10ffff < (uint)codepoint) {
        return -1;
      }
      *buffer = (byte)((uint)codepoint >> 0x12) | 0xf0;
      buffer[1] = (byte)((uint)codepoint >> 0xc) & 0x3f | 0x80;
      buffer[2] = (byte)((uint)codepoint >> 6) & 0x3f | 0x80;
      buffer[3] = bVar2 & 0x3f | 0x80;
      sStack_8 = 4;
    }
    *size = sStack_8;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int utf8_encode(int32_t codepoint, char *buffer, size_t *size)
{
    if(codepoint < 0)
        return -1;
    else if(codepoint < 0x80)
    {
        buffer[0] = (char)codepoint;
        *size = 1;
    }
    else if(codepoint < 0x800)
    {
        buffer[0] = 0xC0 + ((codepoint & 0x7C0) >> 6);
        buffer[1] = 0x80 + ((codepoint & 0x03F));
        *size = 2;
    }
    else if(codepoint < 0x10000)
    {
        buffer[0] = 0xE0 + ((codepoint & 0xF000) >> 12);
        buffer[1] = 0x80 + ((codepoint & 0x0FC0) >> 6);
        buffer[2] = 0x80 + ((codepoint & 0x003F));
        *size = 3;
    }
    else if(codepoint <= 0x10FFFF)
    {
        buffer[0] = 0xF0 + ((codepoint & 0x1C0000) >> 18);
        buffer[1] = 0x80 + ((codepoint & 0x03F000) >> 12);
        buffer[2] = 0x80 + ((codepoint & 0x000FC0) >> 6);
        buffer[3] = 0x80 + ((codepoint & 0x00003F));
        *size = 4;
    }
    else
        return -1;

    return 0;
}